

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketMonitor_UNIX.cpp
# Opt level: O2

void __thiscall FIX::SocketMonitor::unsignal(SocketMonitor *this,socket_handle s)

{
  iterator iVar1;
  key_type local_14;
  
  iVar1 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::find
                    (&(this->m_writeSockets)._M_t,&local_14);
  if ((_Rb_tree_header *)iVar1._M_node != &(this->m_writeSockets)._M_t._M_impl.super__Rb_tree_header
     ) {
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::erase
              (&(this->m_writeSockets)._M_t,&local_14);
  }
  return;
}

Assistant:

void SocketMonitor::unsignal(socket_handle s) {
  Sockets::iterator i = m_writeSockets.find(s);
  if (i == m_writeSockets.end()) {
    return;
  }

  m_writeSockets.erase(s);
}